

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void __thiscall
QApplicationPrivate::QApplicationPrivate(QApplicationPrivate *this,int *argc,char **argv)

{
  char **in_RDX;
  int *in_RSI;
  QApplicationPrivate *in_RDI;
  
  QGuiApplicationPrivate::QGuiApplicationPrivate
            (&in_RDI->super_QGuiApplicationPrivate,in_RSI,in_RDX);
  *(undefined ***)in_RDI = &PTR__QApplicationPrivate_00d06260;
  QList<QGraphicsScene_*>::QList((QList<QGraphicsScene_*> *)0x2c804f);
  QBasicTimer::QBasicTimer(&in_RDI->toolTipWakeUp);
  QBasicTimer::QBasicTimer(&in_RDI->toolTipFallAsleep);
  QPoint::QPoint((QPoint *)in_RDI);
  QPoint::QPoint((QPoint *)in_RDI);
  QPoint::QPoint((QPoint *)in_RDI);
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)0x2c80b5);
  in_RDI->field_0x90 = 1;
  in_RDI->gestureManager = (QGestureManager *)0x0;
  in_RDI->gestureWidget = (QWidget *)0x0;
  if (self == (QApplicationPrivate *)0x0) {
    self = in_RDI;
  }
  return;
}

Assistant:

QApplicationPrivate::QApplicationPrivate(int &argc, char **argv)
    : QGuiApplicationPrivate(argc, argv)
{
    application_type = QApplicationPrivate::Gui;

#ifndef QT_NO_GESTURES
    gestureManager = nullptr;
    gestureWidget = nullptr;
#endif // QT_NO_GESTURES

    if (!self)
        self = this;
}